

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vec_uint.h
# Opt level: O2

vec_uint_t * vec_uint_alloc(uint cap)

{
  vec_uint_t *pvVar1;
  uint *puVar2;
  uint uVar3;
  
  pvVar1 = (vec_uint_t *)malloc(0x10);
  uVar3 = 0x10;
  if (0xe < cap - 1) {
    uVar3 = cap;
  }
  pvVar1->size = 0;
  pvVar1->cap = uVar3;
  if (uVar3 == 0) {
    puVar2 = (uint *)0x0;
  }
  else {
    puVar2 = (uint *)malloc((ulong)uVar3 << 2);
  }
  pvVar1->data = puVar2;
  return pvVar1;
}

Assistant:

static inline vec_uint_t * vec_uint_alloc(unsigned cap)
{
    vec_uint_t *p = satoko_alloc(vec_uint_t, 1);

    if (cap > 0 && cap < 16)
        cap = 16;
    p->size = 0;
    p->cap = cap;
    p->data = p->cap ? satoko_alloc(unsigned, p->cap) : NULL;
    return p;
}